

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall Clasp::ClaspVmtf::setConfig(ClaspVmtf *this,HeuParams *params)

{
  uint uVar1;
  uint *puVar2;
  uint *in_RSI;
  long in_RDI;
  uint32 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint local_30;
  uint local_2c;
  Set local_1c;
  uint local_18;
  uint local_14;
  uint *local_10;
  
  local_10 = in_RSI;
  if ((*in_RSI & 0xffff) == 0) {
    local_2c = 8;
  }
  else {
    local_14 = *in_RSI & 0xffff;
    local_18 = 2;
    puVar2 = std::max<unsigned_int>(&local_14,&local_18);
    local_2c = *puVar2;
  }
  *(uint *)(in_RDI + 0x30) = local_2c;
  if ((*local_10 >> 0x10 & 3) == 0) {
    local_30 = 1;
  }
  else {
    local_30 = *local_10 >> 0x10 & 3;
  }
  *(uint *)(in_RDI + 0x38) = local_30;
  *(bool *)(in_RDI + 0x40) = (*local_10 >> 0x15 & 1) != 0;
  Constraint_t::Set::Set(&local_1c);
  *(uint32 *)(in_RDI + 0x34) = local_1c.m;
  if ((*local_10 >> 0x12 & 3) == 0) {
    uVar1 = 1;
  }
  else {
    uVar1 = *local_10 >> 0x12 & 3;
  }
  addOther((TypeSet *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  if ((*local_10 >> 0x14 & 1) != 0) {
    Constraint_t::Set::addSet((Set *)(in_RDI + 0x34),Static);
  }
  if (*(int *)(in_RDI + 0x38) == 1) {
    Constraint_t::Set::addSet((Set *)(in_RDI + 0x34),Conflict);
  }
  return;
}

Assistant:

void ClaspVmtf::setConfig(const HeuParams& params) {
	nMove_  = params.param ? std::max(params.param, uint32(2)) : 8u;
	scType_ = params.score != HeuParams::score_auto ? params.score : static_cast<uint32>(HeuParams::score_min);
	nant_   = params.nant != 0;
	addOther(types_ = TypeSet(), params.other != HeuParams::other_auto ? params.other : static_cast<uint32>(HeuParams::other_no));
	if (params.moms) { types_.addSet(Constraint_t::Static); }
	if (scType_ == HeuParams::score_min) { types_.addSet(Constraint_t::Conflict); }
}